

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

void newBinNE(IntView<0> x,IntView<0> y,BoolView *r)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  BinNE<0,_0,_0> *this;
  BinNE<0,_4,_0> *this_00;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  IntVar *pIVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  IntVar *pIVar12;
  uint uVar13;
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<4> _y_01;
  IntView<4> _y_02;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<0> _x_02;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  uVar6 = y._8_8_;
  pIVar8 = y.var;
  uVar11 = x._8_8_;
  pIVar12 = x.var;
  uVar4 = uVar11 & 0xffffffff00000000;
  uVar9 = uVar6 & 0xffffffff00000000;
  uVar10 = x.a;
  uVar3 = -uVar10;
  if (0 < (int)uVar10) {
    uVar3 = uVar10;
  }
  uVar10 = (uint)(uVar11 >> 0x1f) & 1;
  uVar13 = uVar10 + 2;
  if (uVar3 < 2) {
    uVar13 = uVar10;
  }
  uVar10 = uVar13 + 4;
  if (uVar11 >> 0x20 == 0) {
    uVar10 = uVar13;
  }
  uVar5 = y.a;
  uVar13 = -uVar5;
  if (0 < (int)uVar5) {
    uVar13 = uVar5;
  }
  uVar5 = (uint)(uVar6 >> 0x1f) & 1;
  uVar7 = uVar5 + 2;
  if (uVar13 < 2) {
    uVar7 = uVar5;
  }
  uVar5 = uVar7 + 4;
  if (uVar6 >> 0x20 == 0) {
    uVar5 = uVar7;
  }
  if (uVar5 == 0 && uVar10 == 0) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this = (BinNE<0,_0,_0> *)operator_new(0x50);
    _x._8_8_ = uVar3 | uVar4;
    _y._8_8_ = uVar13 | uVar9;
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_40.v = r->v;
      local_40.s = r->s;
      _y.var = pIVar8;
      _x.var = pIVar12;
      BinNE<0,_0,_0>::BinNE(this,_x,_y,&local_40);
    }
    else {
      local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_50.v = r->v;
      local_50.s = r->s;
      _y_00.a = (int)_y._8_8_;
      _y_00.b = (int)(_y._8_8_ >> 0x20);
      _y_00.var = pIVar8;
      _x_00.a = (int)_x._8_8_;
      _x_00.b = (int)(_x._8_8_ >> 0x20);
      _x_00.var = pIVar12;
      BinNE<0,_0,_1>::BinNE((BinNE<0,_0,_1> *)this,_x_00,_y_00,&local_50);
    }
  }
  if ((uVar10 == 0) && (uVar5 == 4)) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this_00 = (BinNE<0,_4,_0> *)operator_new(0x50);
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      _x_01._8_8_ = uVar4 | uVar3;
      local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_60.v = r->v;
      local_60.s = r->s;
      _y_01.a = (int)(uVar9 | uVar13);
      _y_01.b = (int)((uVar9 | uVar13) >> 0x20);
      _y_01.var = pIVar8;
      _x_01.var = pIVar12;
      BinNE<0,_4,_0>::BinNE(this_00,_x_01,_y_01,&local_60);
    }
    else {
      _x_02._8_8_ = uVar4 | uVar3;
      local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_70.v = r->v;
      local_70.s = r->s;
      _y_02.a = (int)(uVar9 | uVar13);
      _y_02.b = (int)((uVar9 | uVar13) >> 0x20);
      _y_02.var = pIVar8;
      _x_02.var = pIVar12;
      BinNE<0,_4,_1>::BinNE((BinNE<0,_4,_1> *)this_00,_x_02,_y_02,&local_70);
    }
  }
  return;
}

Assistant:

void newBinNE(IntView<> x, IntView<> y, const BoolView& r = bv_true) {
	const int u = x.getType();
	const int v = y.getType();
	Propagator* p = nullptr;

	BinProp(BinNE, 0, 0);
	BinProp(BinNE, 0, 4);

	assert(p);
}